

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O3

void __thiscall
btSortedOverlappingPairCache::btSortedOverlappingPairCache(btSortedOverlappingPairCache *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  btBroadphasePair *pbVar3;
  undefined8 uVar4;
  btBroadphasePair *pbVar5;
  long lVar6;
  long lVar7;
  
  (this->super_btOverlappingPairCache).super_btOverlappingPairCallback.
  _vptr_btOverlappingPairCallback = (_func_int **)&PTR__btSortedOverlappingPairCache_0021b498;
  (this->m_overlappingPairArray).m_ownsMemory = true;
  (this->m_overlappingPairArray).m_data = (btBroadphasePair *)0x0;
  (this->m_overlappingPairArray).m_size = 0;
  (this->m_overlappingPairArray).m_capacity = 0;
  this->m_blockedForChanges = false;
  this->m_hasDeferredRemoval = true;
  this->m_overlapFilterCallback = (btOverlapFilterCallback *)0x0;
  this->m_ghostPairCallback = (btOverlappingPairCallback *)0x0;
  pbVar5 = (btBroadphasePair *)btAlignedAllocInternal(0x40,0x10);
  lVar6 = (long)(this->m_overlappingPairArray).m_size;
  if (0 < lVar6) {
    lVar7 = 0;
    do {
      pbVar3 = (this->m_overlappingPairArray).m_data;
      puVar1 = (undefined8 *)((long)&pbVar3->m_pProxy0 + lVar7);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pbVar5->m_pProxy0 + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      *(undefined8 *)((long)&pbVar5->m_algorithm + lVar7) =
           *(undefined8 *)((long)&pbVar3->m_algorithm + lVar7);
      *(undefined8 *)((long)&pbVar5->field_3 + lVar7) =
           *(undefined8 *)((long)&pbVar3->field_3 + lVar7);
      lVar7 = lVar7 + 0x20;
    } while (lVar6 * 0x20 != lVar7);
  }
  pbVar3 = (this->m_overlappingPairArray).m_data;
  if ((pbVar3 != (btBroadphasePair *)0x0) && ((this->m_overlappingPairArray).m_ownsMemory == true))
  {
    btAlignedFreeInternal(pbVar3);
  }
  (this->m_overlappingPairArray).m_ownsMemory = true;
  (this->m_overlappingPairArray).m_data = pbVar5;
  (this->m_overlappingPairArray).m_capacity = 2;
  return;
}

Assistant:

btSortedOverlappingPairCache::btSortedOverlappingPairCache():
	m_blockedForChanges(false),
	m_hasDeferredRemoval(true),
	m_overlapFilterCallback(0),
	m_ghostPairCallback(0)
{
	int initialAllocatedSize= 2;
	m_overlappingPairArray.reserve(initialAllocatedSize);
}